

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrespondent.c
# Opt level: O0

int nn_xrespondent_recv(nn_sockbase *self,nn_msg *msg)

{
  uint32_t uVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  uint8_t *buf;
  void *__src;
  nn_sockbase *local_80;
  nn_xrespondent_data *pipedata;
  nn_chunkref ref;
  void *data;
  size_t sz;
  nn_pipe *pnStack_38;
  int i;
  nn_pipe *pipe;
  nn_xrespondent *xrespondent;
  nn_msg *pnStack_20;
  int rc;
  nn_msg *msg_local;
  nn_sockbase *self_local;
  
  local_80 = self;
  if (self == (nn_sockbase *)0x0) {
    local_80 = (nn_sockbase *)0x0;
  }
  pipe = (nn_pipe *)local_80;
  pnStack_20 = msg;
  msg_local = (nn_msg *)self;
  xrespondent._4_4_ = nn_fq_recv((nn_fq *)&local_80[2].sock,msg,&stack0xffffffffffffffc8);
  self_local._4_4_ = xrespondent._4_4_;
  if (-1 < (int)xrespondent._4_4_) {
    if ((xrespondent._4_4_ & 2) == 0) {
      ref.u._24_8_ = nn_chunkref_data(&pnStack_20->body);
      sVar3 = nn_chunkref_size(&pnStack_20->body);
      for (sz._4_4_ = 0; (ulong)((long)(sz._4_4_ + 1) * 4) <= sVar3; sz._4_4_ = sz._4_4_ + 1) {
        uVar1 = nn_getl((uint8_t *)(ref.u._24_8_ + (long)sz._4_4_ * 4));
        if ((uVar1 & 0x80000000) != 0) {
          iVar2 = sz._4_4_ + 1;
          sVar3 = nn_chunkref_size(&pnStack_20->sphdr);
          if (sVar3 != 0) {
            fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_chunkref_size (&msg->sphdr) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/survey/xrespondent.c"
                    ,0xe7);
            fflush(_stderr);
            nn_err_abort();
          }
          nn_chunkref_term(&pnStack_20->sphdr);
          nn_chunkref_init(&pnStack_20->sphdr,(long)iVar2 << 2);
          pvVar4 = nn_chunkref_data(&pnStack_20->sphdr);
          memcpy(pvVar4,(void *)ref.u._24_8_,(long)iVar2 << 2);
          nn_chunkref_trim(&pnStack_20->body,(long)iVar2 << 2);
          goto LAB_0012b229;
        }
      }
      nn_msg_term(pnStack_20);
      self_local._4_4_ = 0xfffffff5;
    }
    else {
LAB_0012b229:
      pvVar4 = nn_pipe_getdata(pnStack_38);
      sVar3 = nn_chunkref_size(&pnStack_20->sphdr);
      nn_chunkref_init((nn_chunkref *)&pipedata,sVar3 + 4);
      buf = (uint8_t *)nn_chunkref_data((nn_chunkref *)&pipedata);
      nn_putl(buf,*(uint32_t *)((long)pvVar4 + 8));
      pvVar4 = nn_chunkref_data((nn_chunkref *)&pipedata);
      __src = nn_chunkref_data(&pnStack_20->sphdr);
      sVar3 = nn_chunkref_size(&pnStack_20->sphdr);
      memcpy((void *)((long)pvVar4 + 4),__src,sVar3);
      nn_chunkref_term(&pnStack_20->sphdr);
      nn_chunkref_mv(&pnStack_20->sphdr,(nn_chunkref *)&pipedata);
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

int nn_xrespondent_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_xrespondent *xrespondent;
    struct nn_pipe *pipe;
    int i;
    size_t sz;
    void *data;
    struct nn_chunkref ref;
    struct nn_xrespondent_data *pipedata;

    xrespondent = nn_cont (self, struct nn_xrespondent, sockbase);

    rc = nn_fq_recv (&xrespondent->inpipes, msg, &pipe);
    if (nn_slow (rc < 0))
        return rc;

    /*  Split the header (including survey ID) from the body, if needed. */
    if (!(rc & NN_PIPE_PARSED)) {

        /*  Determine the size of the message header. */
        data = nn_chunkref_data (&msg->body);
        sz = nn_chunkref_size (&msg->body);
        i = 0;

        while (1) {
	    /*  Ignore the malformed surveys without the bottom of the stack. */
	    if (nn_slow ((i + 1) * sizeof (uint32_t) > sz)) {
                nn_msg_term (msg);
                return -EAGAIN;
            }

            /*  If the bottom of the backtrace stack is reached, proceed. */
            if (nn_getl ((uint8_t*)(((uint32_t*) data) + i)) & 0x80000000)
                break;

            ++i;
        }
        ++i;
    
        nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
        nn_chunkref_term (&msg->sphdr);
        nn_chunkref_init (&msg->sphdr, i * sizeof (uint32_t));
        memcpy (nn_chunkref_data (&msg->sphdr), data, i * sizeof (uint32_t));
        nn_chunkref_trim (&msg->body, i * sizeof (uint32_t));
    }

    /*  Prepend the header by the pipe key. */
    pipedata = nn_pipe_getdata (pipe);
    nn_chunkref_init (&ref, nn_chunkref_size (&msg->sphdr) + sizeof (uint32_t));
    nn_putl (nn_chunkref_data (&ref), pipedata->outitem.key);
    memcpy (((uint8_t *) nn_chunkref_data (&ref)) + sizeof (uint32_t),
        nn_chunkref_data (&msg->sphdr), nn_chunkref_size (&msg->sphdr));
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_mv (&msg->sphdr, &ref);

    return 0;
}